

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O0

int BiCG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,int64_t *max_iter,double *tol)

{
  float fVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDI;
  long *in_R8;
  double *in_R9;
  float fVar3;
  float fVar4;
  REAL RVar5;
  int64_t i;
  TPZFMatrix<float> rtilde;
  TPZFMatrix<float> r;
  double normb;
  TPZFMatrix<float> qtilde;
  TPZFMatrix<float> q;
  TPZFMatrix<float> ptilde;
  TPZFMatrix<float> p;
  TPZFMatrix<float> ztilde;
  TPZFMatrix<float> z;
  TPZFMatrix<float> beta;
  TPZFMatrix<float> alpha;
  TPZFMatrix<float> rho_2;
  TPZFMatrix<float> rho_1;
  double resid;
  float in_stack_fffffffffffff548;
  float in_stack_fffffffffffff54c;
  TPZFMatrix<float> *in_stack_fffffffffffff550;
  float *in_stack_fffffffffffff558;
  TPZFMatrix<float> *in_stack_fffffffffffff560;
  TPZFMatrix<float> *in_stack_fffffffffffff568;
  TPZFMatrix<float> *in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff578;
  float in_stack_fffffffffffff57c;
  TPZFMatrix<float> *in_stack_fffffffffffff580;
  float in_stack_fffffffffffff588;
  float in_stack_fffffffffffff58c;
  TPZFMatrix<float> *in_stack_fffffffffffff590;
  TPZFMatrix<float> *in_stack_fffffffffffff598;
  TPZFMatrix<float> *in_stack_fffffffffffff5a0;
  TPZFMatrix<float> *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  long local_7b8;
  undefined1 local_7a8 [288];
  undefined1 local_688 [144];
  double local_5f8;
  undefined1 local_5f0 [288];
  TPZFMatrix<float> local_4d0;
  TPZFMatrix<float> local_440;
  TPZFMatrix<float> local_3b0;
  TPZFMatrix<float> local_320;
  TPZFMatrix<float> local_290;
  TPZFMatrix<float> local_200;
  TPZFMatrix<float> local_160;
  TPZFMatrix<float> local_d0;
  double local_40;
  double *local_38;
  long *local_30;
  long *local_28;
  long *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,(int64_t)in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,(int64_t)in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,(int64_t)in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,(int64_t)in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff580);
  fVar3 = Norm((TPZFMatrix<float> *)0x12fd393);
  local_5f8 = TPZExtractVal::val(fVar3);
  TPZMatrix<float>::operator*
            ((TPZMatrix<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
             in_stack_fffffffffffff580);
  TPZFMatrix<float>::operator-
            ((TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
             in_stack_fffffffffffff5b0);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd410);
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  if ((local_5f8 == 0.0) && (!NAN(local_5f8))) {
    local_5f8 = 1.0;
  }
  fVar3 = Norm((TPZFMatrix<float> *)0x12fd59f);
  RVar5 = TPZExtractVal::val(fVar3);
  local_40 = (double)(-(ulong)(RVar5 / local_5f8 <= *local_38) & 0x3ff0000000000000);
  if ((local_40 != 0.0) || (NAN(local_40))) {
    *local_38 = local_40;
    *local_30 = 0;
    local_4 = 0;
  }
  else {
    for (local_7b8 = 1; fVar3 = (float)((ulong)in_stack_fffffffffffff558 >> 0x20),
        local_7b8 <= *local_30; local_7b8 = local_7b8 + 1) {
      (**(code **)(*local_28 + 0x58))(local_28,local_688,&local_320,0);
      (**(code **)(*local_28 + 0x58))(local_28,local_7a8,&local_3b0,0);
      fVar4 = Dot<float>((TPZFMatrix<float> *)
                         CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                         in_stack_fffffffffffff570);
      pfVar2 = TPZFMatrix<float>::operator()(&local_d0,0);
      *pfVar2 = fVar4;
      pfVar2 = TPZFMatrix<float>::operator()(&local_d0,0);
      RVar5 = TPZExtractVal::val(*pfVar2);
      if ((RVar5 == 0.0) && (!NAN(RVar5))) {
        fVar3 = Norm((TPZFMatrix<float> *)0x12fd753);
        RVar5 = TPZExtractVal::val(fVar3);
        *local_38 = RVar5 / local_5f8;
        *local_30 = local_7b8;
        local_4 = 2;
        goto LAB_012fdc9f;
      }
      if (local_7b8 == 1) {
        TPZFMatrix<float>::operator=(in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        TPZFMatrix<float>::operator=(in_stack_fffffffffffff568,in_stack_fffffffffffff560);
      }
      else {
        pfVar2 = TPZFMatrix<float>::operator()(&local_d0,0);
        fVar4 = *pfVar2;
        pfVar2 = TPZFMatrix<float>::operator()(&local_160,0);
        fVar1 = *pfVar2;
        pfVar2 = TPZFMatrix<float>::operator()(&local_290,0);
        *pfVar2 = fVar4 / fVar1;
        in_stack_fffffffffffff5a0 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_290,0)
        ;
        TPZFMatrix<float>::TimesBetaPlusZ
                  (&local_440,
                   *(float *)&(in_stack_fffffffffffff5a0->super_TPZMatrix<float>).
                              super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable,&local_320);
        in_stack_fffffffffffff598 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_290,0)
        ;
        TPZFMatrix<float>::TimesBetaPlusZ
                  (&local_4d0,
                   *(float *)&(in_stack_fffffffffffff598->super_TPZMatrix<float>).
                              super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable,&local_3b0);
      }
      TPZMatrix<float>::operator*
                ((TPZMatrix<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                 in_stack_fffffffffffff580);
      TPZFMatrix<float>::operator=
                (in_stack_fffffffffffff550,
                 (TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548))
      ;
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fd927);
      (**(code **)(*local_10 + 0x128))(local_10,&local_4d0,local_5f0,1);
      pfVar2 = TPZFMatrix<float>::operator()(&local_d0,0);
      in_stack_fffffffffffff588 = *pfVar2;
      in_stack_fffffffffffff58c =
           Dot<float>((TPZFMatrix<float> *)
                      CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                      in_stack_fffffffffffff570);
      in_stack_fffffffffffff57c = in_stack_fffffffffffff588 / in_stack_fffffffffffff58c;
      in_stack_fffffffffffff580 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_200,0);
      *(float *)&(in_stack_fffffffffffff580->super_TPZMatrix<float>).super_TPZBaseMatrix.
                 super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffff57c;
      in_stack_fffffffffffff570 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_200,0);
      operator*(fVar3,in_stack_fffffffffffff550);
      TPZFMatrix<float>::operator+=
                (in_stack_fffffffffffff5a0,&in_stack_fffffffffffff598->super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fda2f);
      in_stack_fffffffffffff568 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_200,0);
      operator*(fVar3,in_stack_fffffffffffff550);
      TPZFMatrix<float>::operator-=
                (in_stack_fffffffffffff5a0,&in_stack_fffffffffffff598->super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fda8b);
      in_stack_fffffffffffff560 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_200,0);
      operator*(fVar3,in_stack_fffffffffffff550);
      TPZFMatrix<float>::operator-=
                (in_stack_fffffffffffff5a0,&in_stack_fffffffffffff598->super_TPZMatrix<float>);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdae7);
      in_stack_fffffffffffff558 = TPZFMatrix<float>::operator()(&local_d0,0);
      in_stack_fffffffffffff54c = *in_stack_fffffffffffff558;
      in_stack_fffffffffffff550 = (TPZFMatrix<float> *)TPZFMatrix<float>::operator()(&local_160,0);
      *(float *)&(in_stack_fffffffffffff550->super_TPZMatrix<float>).super_TPZBaseMatrix.
                 super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffff54c;
      in_stack_fffffffffffff548 = Norm((TPZFMatrix<float> *)0x12fdb42);
      RVar5 = TPZExtractVal::val(in_stack_fffffffffffff548);
      local_40 = RVar5 / local_5f8;
      if (local_40 < *local_38) {
        *local_38 = local_40;
        *local_30 = local_7b8;
        local_4 = 0;
        goto LAB_012fdc9f;
      }
    }
    *local_38 = local_40;
    local_4 = 1;
  }
LAB_012fdc9f:
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdcac);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdcb9);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdcc6);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdcd3);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdce0);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdced);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdcfa);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdd07);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdd14);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdd21);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdd2e);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fdd3b);
  return local_4;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}